

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

boolean can_carry(monst *mtmp,obj *otmp)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  permonst *ptr;
  permonst *ppVar4;
  boolean bVar5;
  int iVar6;
  obj *poVar7;
  int iVar8;
  
  ptr = mtmp->data;
  if ((ptr->mflags1 & 0x800) != 0) {
    return '\0';
  }
  sVar1 = otmp->otyp;
  uVar2 = otmp->owt;
  if (sVar1 == 0x10e) {
    if (otmp->corpsenm - 0xbU < 2) {
      if (((mtmp->misc_worn_check & 0x10) == 0) && ((mtmp->mintrinsics & 0x80) == 0)) {
        return '\0';
      }
    }
    else if (otmp->corpsenm - 0x144U < 3) {
      return '\0';
    }
  }
  if (((*(ushort *)&objects[sVar1].field_0x11 & 0x1f0) == 0xe0) &&
     (bVar5 = hates_silver(ptr), bVar5 != '\0')) {
    if (sVar1 != 0x10c) {
      return '\0';
    }
    if ((ptr->mflags3 & 0x1f) == 0) {
      return '\0';
    }
    if (u.usteed == mtmp) {
      return '\0';
    }
  }
  else if (u.usteed == mtmp) {
    return '\0';
  }
  uVar3 = *(uint *)&mtmp->field_0x60;
  if ((uVar3 >> 0x19 & 1) != 0) {
    return '\x01';
  }
  if (((uVar3 >> 0x16 & 1) != 0) && (mtmp->mtame == '\0')) {
    return '\0';
  }
  if ((ptr->mflags2 & 0x8000000) == 0) {
    ppVar4 = mtmp->data;
    if ((((ppVar4 == mons + 0x145 ||
          (ppVar4 == mons + 0x146 || (ppVar4 == mons + 0x144 || ppVar4 == mons + 0x11b))) ||
         ppVar4->msound == '\x1f') && (uVar3 >> 0x16 & 1) == 0) && sVar1 == 0x214) {
      return '\x01';
    }
  }
  else if (sVar1 == 0x214) {
    return '\x01';
  }
  if (ptr->mlet != '\x0e') {
    iVar8 = 0;
    for (poVar7 = mtmp->minvent; poVar7 != (obj *)0x0; poVar7 = poVar7->nobj) {
      if ((poVar7->otyp != 0x214) || ((mtmp->data->mflags2 & 0x8000000) == 0)) {
        iVar8 = iVar8 + poVar7->owt;
      }
    }
    iVar6 = max_mon_load(mtmp);
    return (int)(iVar8 + uVar2) <= iVar6;
  }
  return otmp->oclass != '\x0e';
}

Assistant:

boolean can_carry(struct monst *mtmp, struct obj *otmp)
{
	int otyp = otmp->otyp, newload = otmp->owt;
	const struct permonst *mdat = mtmp->data;

	if (notake(mdat)) return FALSE;		/* can't carry anything */

	if (otyp == CORPSE && touch_petrifies(&mons[otmp->corpsenm]) &&
		!(mtmp->misc_worn_check & W_ARMG) && !resists_ston(mtmp))
	    return FALSE;
	if (otyp == CORPSE && is_rider(&mons[otmp->corpsenm]))
	    return FALSE;
	if (objects[otyp].oc_material == SILVER && hates_silver(mdat) &&
		(otyp != BELL_OF_OPENING || !is_covetous(mdat)))
	    return FALSE;

	/* Steeds don't pick up stuff (to avoid shop abuse) */
	if (mtmp == u.usteed) return FALSE;
	if (mtmp->isshk) return TRUE; /* no limit */
	if (mtmp->mpeaceful && !mtmp->mtame) return FALSE;
	/* otherwise players might find themselves obligated to violate
	 * their alignment if the monster takes something they need
	 */

	/* special--boulder throwers carry unlimited amounts of boulders
	 * and some monsters can shatter boulders (will be handled in mpickstuff)
	 */
	if ((throws_rocks(mdat) || is_rockbreaker(mtmp)) && otyp == BOULDER)
		return TRUE;

	/* nymphs deal in stolen merchandise, but not boulders or statues */
	if (mdat->mlet == S_NYMPH)
		return (boolean)(otmp->oclass != ROCK_CLASS);

	if (curr_mon_load(mtmp) + newload > max_mon_load(mtmp)) return FALSE;

	return TRUE;
}